

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O3

void __thiscall EVPExtraTest_Print_Test::TestBody(EVPExtraTest_Print_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  pointer pcVar5;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<EVP_PKEY> ec;
  UniquePtr<EVP_PKEY> dsa;
  UniquePtr<EVP_PKEY> rsa;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  AssertHelper local_30;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_28;
  AssertHelper local_20;
  
  p_Var2 = (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)0x260;
  ParsePrivateKey((int)&local_28,&DAT_00000006,0x534390);
  local_70[0] = (internal)(local_28._M_head_impl != (EVP_PKEY *)0x0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_28._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,local_70,(AssertionResult *)0x5a8385,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x201,local_60._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((EVP_PKEY *)local_38._M_head_impl != (EVP_PKEY *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
  }
  else {
    PrintToString_abi_cxx11_(&local_60,local_28._M_head_impl,0x46b8bc,p_Var2);
    pbVar3 = &local_60;
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[36]>
              (local_70,"PrintToString(rsa.get(), 2, &EVP_PKEY_print_params)",
               "\"  Parameters algorithm unsupported\\n\"",pbVar3,
               (char (*) [36])"  Parameters algorithm unsupported\n");
    paVar1 = &local_60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_68->_M_dataplus)._M_p;
      }
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x203;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x203,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    PrintToString_abi_cxx11_
              (&local_60,local_28._M_head_impl,0x46b7c8,
               (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
    pbVar3 = &local_60;
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[514]>
              (local_70,"PrintToString(rsa.get(), 2, &EVP_PKEY_print_public)",
               "R\"(  Public-Key: (1024 bit)\n  Modulus:\n      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:\n      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:\n      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:\n      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:\n      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:\n      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:\n      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:\n      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:\n      a7:2c:2b:b5:af:64:4b:61:07\n  Exponent: 65537 (0x10001)\n)\""
               ,pbVar3,(char (*) [514])
                       "  Public-Key: (1024 bit)\n  Modulus:\n      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:\n      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:\n      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:\n      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:\n      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:\n      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:\n      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:\n      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:\n      a7:2c:2b:b5:af:64:4b:61:07\n  Exponent: 65537 (0x10001)\n"
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_68->_M_dataplus)._M_p;
      }
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x211;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x211,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    PrintToString_abi_cxx11_
              (&local_60,local_28._M_head_impl,0x46b842,
               (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[2186]>
              (local_70,"PrintToString(rsa.get(), 2, &EVP_PKEY_print_private)",
               "R\"(  Private-Key: (1024 bit)\n  modulus:\n      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:\n      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:\n      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:\n      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:\n      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:\n      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:\n      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:\n      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:\n      a7:2c:2b:b5:af:64:4b:61:07\n  publicExponent: 65537 (0x10001)\n  privateExponent:\n      74:88:64:3f:69:45:3a:6d:c7:7f:b9:a3:c0:6e:ec:\n      dc:d4:5a:b5:32:85:5f:19:d4:f8:d4:3f:3c:fa:c2:\n      f6:5f:ee:e6:ba:87:74:2e:c7:0c:d4:42:b8:66:85:\n      9c:7b:24:61:aa:16:11:f6:b5:b6:a4:0a:c9:55:2e:\n      81:a5:47:61:cb:25:8f:c2:15:7b:0e:7c:36:9f:3a:\n      da:58:86:1c:5b:83:79:e6:2b:cc:e6:fa:2c:61:f2:\n      78:80:1b:e2:f3:9d:39:2b:65:57:91:3d:71:99:73:\n      a5:c2:79:20:8c:07:4f:e5:b4:60:1f:99:a2:b1:4f:\n      0c:ef:bc:59:53:00:7d:b1\n  prime1:\n      00:fc:7e:23:65:70:f8:ce:d3:40:41:80:6a:1d:01:\n      d6:01:ff:b6:1b:3d:3d:59:09:33:79:c0:4f:de:96:\n      27:4b:18:c6:d9:78:f1:f4:35:46:e9:7c:42:7a:5d:\n      9f:ef:54:b8:f7:9f:c4:33:6c:f3:8c:32:46:87:67:\n      30:7b:a7:ac:e3\n  prime2:\n      00:fc:2c:df:0c:0d:88:f5:b1:92:a8:93:47:63:55:\n      f5:ca:58:43:ba:1c:e5:9e:b6:95:05:cd:b5:82:df:\n      eb:04:53:9d:bd:c2:38:16:b3:62:dd:a1:46:db:6d:\n      97:93:9f:8a:c3:9b:64:7e:42:e3:32:57:19:1b:d5:\n      6e:85:fa:b8:8d\n  exponent1:\n      00:bc:3d:de:6d:d6:97:e8:ba:9e:81:37:17:e5:a0:\n      64:c9:00:b7:e7:fe:f4:29:d9:2e:43:6b:19:20:bd:\n      99:75:e7:76:f8:d3:ae:af:7e:b8:eb:81:f4:9d:fe:\n      07:2b:0b:63:0b:5a:55:90:71:7d:f1:db:d9:b1:41:\n      41:68:2f:4e:39\n  exponent2:\n      5a:34:66:d8:f5:e2:7f:18:b5:00:6e:26:84:27:14:\n      93:fb:fc:c6:0f:5e:27:e6:e1:e9:c0:8a:e4:34:da:\n      e9:a2:4b:73:bc:8c:b9:ba:13:6c:7a:2b:51:84:a3:\n      4a:e0:30:10:06:7e:ed:17:5a:14:00:c9:ef:85:ea:\n      52:2c:bc:65\n  coefficient:\n      51:e3:f2:83:19:9b:c4:1e:2f:50:3d:df:5a:a2:18:\n      ca:5f:2e:49:af:6f:cc:fa:65:7..." /* TRUNCATED STRING LITERAL */
               ,&local_60,
               (char (*) [2186])
               "  Private-Key: (1024 bit)\n  modulus:\n      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:\n      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:\n      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:\n      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:\n      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:\n      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:\n      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:\n      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:\n      a7:2c:2b:b5:af:64:4b:61:07\n  publicExponent: 65537 (0x10001)\n  privateExponent:\n      74:88:64:3f:69:45:3a:6d:c7:7f:b9:a3:c0:6e:ec:\n      dc:d4:5a:b5:32:85:5f:19:d4:f8:d4:3f:3c:fa:c2:\n      f6:5f:ee:e6:ba:87:74:2e:c7:0c:d4:42:b8:66:85:\n      9c:7b:24:61:aa:16:11:f6:b5:b6:a4:0a:c9:55:2e:\n      81:a5:47:61:cb:25:8f:c2:15:7b:0e:7c:36:9f:3a:\n      da:58:86:1c:5b:83:79:e6:2b:cc:e6:fa:2c:61:f2:\n      78:80:1b:e2:f3:9d:39:2b:65:57:91:3d:71:99:73:\n      a5:c2:79:20:8c:07:4f:e5:b4:60:1f:99:a2:b1:4f:\n      0c:ef:bc:59:53:00:7d:b1\n  prime1:\n      00:fc:7e:23:65:70:f8:ce:d3:40:41:80:6a:1d:01:\n      d6:01:ff:b6:1b:3d:3d:59:09:33:79:c0:4f:de:96:\n      27:4b:18:c6:d9:78:f1:f4:35:46:e9:7c:42:7a:5d:\n      9f:ef:54:b8:f7:9f:c4:33:6c:f3:8c:32:46:87:67:\n      30:7b:a7:ac:e3\n  prime2:\n      00:fc:2c:df:0c:0d:88:f5:b1:92:a8:93:47:63:55:\n      f5:ca:58:43:ba:1c:e5:9e:b6:95:05:cd:b5:82:df:\n      eb:04:53:9d:bd:c2:38:16:b3:62:dd:a1:46:db:6d:\n      97:93:9f:8a:c3:9b:64:7e:42:e3:32:57:19:1b:d5:\n      6e:85:fa:b8:8d\n  exponent1:\n      00:bc:3d:de:6d:d6:97:e8:ba:9e:81:37:17:e5:a0:\n      64:c9:00:b7:e7:fe:f4:29:d9:2e:43:6b:19:20:bd:\n      99:75:e7:76:f8:d3:ae:af:7e:b8:eb:81:f4:9d:fe:\n      07:2b:0b:63:0b:5a:55:90:71:7d:f1:db:d9:b1:41:\n      41:68:2f:4e:39\n  exponent2:\n      5a:34:66:d8:f5:e2:7f:18:b5:00:6e:26:84:27:14:\n      93:fb:fc:c6:0f:5e:27:e6:e1:e9:c0:8a:e4:34:da:\n      e9:a2:4b:73:bc:8c:b9:ba:13:6c:7a:2b:51:84:a3:\n      4a:e0:30:10:06:7e:ed:17:5a:14:00:c9:ef:85:ea:\n      52:2c:bc:65\n  coefficient:\n      51:e3:f2:83:19:9b:c4:1e:2f:50:3d:df:5a:a2:18:\n      ca:5f:2e:49:af:6f:cc:fa:65:77:9..." /* TRUNCATED STRING LITERAL */
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x247,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
      if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
    }
    if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_68,local_68);
    }
    p_Var2 = (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)0x35a;
    ParsePrivateKey((int)&local_38,(uint8_t *)0x74,0x534b00);
    local_70[0] = (internal)((EVP_PKEY *)local_38._M_head_impl != (EVP_PKEY *)0x0);
    local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((EVP_PKEY *)local_38._M_head_impl == (EVP_PKEY *)0x0) {
      testing::Message::Message((Message *)&local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_60,local_70,(AssertionResult *)0x5a839a,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_30,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x24b,local_60._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper(&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_40._M_head_impl != (EVP_PKEY *)0x0) {
        (**(code **)(*(long *)local_40._M_head_impl + 8))();
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
    }
    else {
      PrintToString_abi_cxx11_(&local_60,(EVP_PKEY *)local_38._M_head_impl,0x46b8bc,p_Var2);
      pbVar3 = &local_60;
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[1953]>
                (local_70,"PrintToString(dsa.get(), 2, &EVP_PKEY_print_params)",
                 "R\"(  DSA-Parameters: (2048 bit)\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:\n      b5:4f:c3\n  G:\n      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:\n      f4:a4:93:59:12:20:22:36:69:cf:41:93:ed:ab:42:\n      3a:d0:8d:fb:55:2e:30:8a:6a:57:a5:ff:bc:7c:d0:\n      fb:20:87:f8:1f:8d:f0:cb:08:ab:21:33:28:7d:2b:\n      69:68:71:4a:94:f6:33:c9:40:84:5a:48:a3:e1:67:\n      08:dd:e7:61:cc:6a:8e:ab:2d:84:db:21:b6:ea:5b:\n      07:68:14:93:cc:9c:31:fb:c3:68:b2:43:f6:dd:f8:\n      c9:32:a8:b4:03:8f:44:e7:b1:5c:a8:76:34:4a:14:\n      78:59:f2:b4:3b:39:45:86:68:ad:5e:0a:1a:9a:66:\n      95:46:dd:28:12:e3:b3:61:7a:0a:ef:99:d5:8e:3b:\n      b4:cc:87:fd:94:22:5e:01:d2:dc:c4:69:a7:72:68:\n      14:6c:51:91:8f:18:e8:b4:d7:0a:a1:f0:c7:62:3b:\n      cc:52:cf:37:31:d3:86:41:b2:d2:83:0b:7e:ec:b2:\n      f0:95:52:ff:13:7d:04:6e:49:4e:7f:33:c3:59:00:\n      02:b1:6d:1b:97:d9:36:fd:a2:8f:90:c3:ed:3c:a3:\n      53:38:16:8a:c1:6f:77:c3:c5:7a:dc:2e:8f:7c:6c:\n      22:56:e4:1a:5f:65:45:05:90:db:b5:bc:f0:6d:66:\n      61\n)\""
                 ,pbVar3,(char (*) [1953])
                         "  DSA-Parameters: (2048 bit)\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:\n      b5:4f:c3\n  G:\n      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:\n      f4:a4:93:59:12:20:22:36:69:cf:41:93:ed:ab:42:\n      3a:d0:8d:fb:55:2e:30:8a:6a:57:a5:ff:bc:7c:d0:\n      fb:20:87:f8:1f:8d:f0:cb:08:ab:21:33:28:7d:2b:\n      69:68:71:4a:94:f6:33:c9:40:84:5a:48:a3:e1:67:\n      08:dd:e7:61:cc:6a:8e:ab:2d:84:db:21:b6:ea:5b:\n      07:68:14:93:cc:9c:31:fb:c3:68:b2:43:f6:dd:f8:\n      c9:32:a8:b4:03:8f:44:e7:b1:5c:a8:76:34:4a:14:\n      78:59:f2:b4:3b:39:45:86:68:ad:5e:0a:1a:9a:66:\n      95:46:dd:28:12:e3:b3:61:7a:0a:ef:99:d5:8e:3b:\n      b4:cc:87:fd:94:22:5e:01:d2:dc:c4:69:a7:72:68:\n      14:6c:51:91:8f:18:e8:b4:d7:0a:a1:f0:c7:62:3b:\n      cc:52:cf:37:31:d3:86:41:b2:d2:83:0b:7e:ec:b2:\n      f0:95:52:ff:13:7d:04:6e:49:4e:7f:33:c3:59:00:\n      02:b1:6d:1b:97:d9:36:fd:a2:8f:90:c3:ed:3c:a3:\n      53:38:16:8a:c1:6f:77:c3:c5:7a:dc:2e:8f:7c:6c:\n      22:56:e4:1a:5f:65:45:05:90:db:b5:bc:f0:6d:66:\n      61\n"
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_68->_M_dataplus)._M_p;
        }
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x278;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x278,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
        if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      PrintToString_abi_cxx11_
                (&local_60,(EVP_PKEY *)local_38._M_head_impl,0x46b7c8,
                 (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
      pbVar3 = &local_60;
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[2849]>
                (local_70,"PrintToString(dsa.get(), 2, &EVP_PKEY_print_public)",
                 "R\"(  Public-Key: (2048 bit)\n  pub:\n      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:\n      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:\n      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:\n      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:\n      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:\n      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:\n      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:\n      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:\n      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:\n      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:\n      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:\n      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:\n      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:\n      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:\n      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:\n      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:\n      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:\n      cc\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:\n      b5:4f:c3\n  G:\n      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:\n      f4:a4:93:59:12:20:22:36:69:cf:41..." /* TRUNCATED STRING LITERAL */
                 ,pbVar3,(char (*) [2849])
                         "  Public-Key: (2048 bit)\n  pub:\n      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:\n      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:\n      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:\n      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:\n      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:\n      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:\n      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:\n      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:\n      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:\n      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:\n      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:\n      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:\n      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:\n      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:\n      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:\n      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:\n      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:\n      cc\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:\n      b5:4f:c3\n  G:\n      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:\n      f4:a4:93:59:12:20:22:36:69:cf:41:93..." /* TRUNCATED STRING LITERAL */
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_68->_M_dataplus)._M_p;
        }
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b8;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x2b8,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
        if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      PrintToString_abi_cxx11_
                (&local_60,(EVP_PKEY *)local_38._M_head_impl,0x46b842,
                 (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[2977]>
                (local_70,"PrintToString(dsa.get(), 2, &EVP_PKEY_print_private)",
                 "R\"(  Private-Key: (2048 bit)\n  priv:\n      00:b0:c7:68:70:27:43:bc:51:24:29:93:a9:71:a5:\n      28:89:79:54:44:f7:c6:45:22:03:d0:ce:84:fe:61:\n      17:d4:6e\n  pub:\n      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:\n      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:\n      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:\n      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:\n      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:\n      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:\n      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:\n      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:\n      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:\n      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:\n      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:\n      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:\n      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:\n      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:\n      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:\n      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:\n      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:\n      cc\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8..." /* TRUNCATED STRING LITERAL */
                 ,&local_60,
                 (char (*) [2977])
                 "  Private-Key: (2048 bit)\n  priv:\n      00:b0:c7:68:70:27:43:bc:51:24:29:93:a9:71:a5:\n      28:89:79:54:44:f7:c6:45:22:03:d0:ce:84:fe:61:\n      17:d4:6e\n  pub:\n      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:\n      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:\n      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:\n      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:\n      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:\n      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:\n      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:\n      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:\n      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:\n      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:\n      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:\n      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:\n      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:\n      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:\n      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:\n      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:\n      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:\n      cc\n  P:\n      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:\n      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:\n      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:\n      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:\n      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:\n      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:\n      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:\n      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:\n      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:\n      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:\n      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:\n      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:\n      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:\n      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:\n      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:\n      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:\n      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:\n      3d:2b\n  Q:\n      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:\n      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d..." /* TRUNCATED STRING LITERAL */
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = (local_68->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x2fc,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
        if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      p_Var2 = (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)0x79;
      ParsePrivateKey((int)&local_40,&DAT_00000198,0x534870);
      local_70[0] = (internal)(local_40._M_head_impl != (EVP_PKEY *)0x0);
      local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_40._M_head_impl == (EVP_PKEY *)0x0) {
        testing::Message::Message((Message *)&local_30);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_60,local_70,(AssertionResult *)0x53a024,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_20,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x300,local_60._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&local_20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_30.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_30.data_ + 8))();
        }
      }
      else {
        PrintToString_abi_cxx11_(&local_60,local_40._M_head_impl,0x46b8bc,p_Var2);
        pbVar3 = &local_60;
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
                  (local_70,"PrintToString(ec.get(), 2, &EVP_PKEY_print_params)",
                   "\"  ECDSA-Parameters: (P-256)\\n\"",pbVar3,
                   (char (*) [29])"  ECDSA-Parameters: (P-256)\n");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_68->_M_dataplus)._M_p;
          }
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x302;
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x302,pcVar5);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
          }
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
        PrintToString_abi_cxx11_
                  (&local_60,local_40._M_head_impl,0x46b7c8,
                   (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
        pbVar3 = &local_60;
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[259]>
                  (local_70,"PrintToString(ec.get(), 2, &EVP_PKEY_print_public)",
                   "R\"(  Public-Key: (P-256)\n  pub:\n      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:\n      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:\n      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:\n      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:\n      4b:cf:72:22:c1\n)\""
                   ,pbVar3,(char (*) [259])
                           "  Public-Key: (P-256)\n  pub:\n      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:\n      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:\n      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:\n      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:\n      4b:cf:72:22:c1\n"
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_68->_M_dataplus)._M_p;
          }
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30b;
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x30b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
          }
        }
        if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_68,local_68);
        }
        PrintToString_abi_cxx11_
                  (&local_60,local_40._M_head_impl,0x46b842,
                   (_func_int_BIO_ptr_EVP_PKEY_ptr_int_ASN1_PCTX_ptr *)pbVar3);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[384]>
                  (local_70,"PrintToString(ec.get(), 2, &EVP_PKEY_print_private)",
                   "R\"(  Private-Key: (P-256)\n  priv:\n      07:0f:08:72:7a:d4:a0:4a:9c:dd:59:c9:4d:89:68:\n      77:08:b5:6f:c9:5d:30:77:0e:e8:d1:c9:ce:0a:8b:\n      b4:6a\n  pub:\n      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:\n      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:\n      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:\n      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:\n      4b:cf:72:22:c1\n)\""
                   ,&local_60,
                   (char (*) [384])
                   "  Private-Key: (P-256)\n  priv:\n      07:0f:08:72:7a:d4:a0:4a:9c:dd:59:c9:4d:89:68:\n      77:08:b5:6f:c9:5d:30:77:0e:e8:d1:c9:ce:0a:8b:\n      b4:6a\n  pub:\n      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:\n      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:\n      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:\n      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:\n      4b:cf:72:22:c1\n"
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != paVar1) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_70[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = "";
          }
          else {
            pcVar5 = (local_68->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x318,pcVar5);
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
          }
        }
      }
      if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_68,local_68);
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_40);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_38);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_28);
  return;
}

Assistant:

TEST(EVPExtraTest, Print) {
  bssl::UniquePtr<EVP_PKEY> rsa = ParsePrivateKey(
      EVP_PKEY_RSA, kExampleRSAKeyDER, sizeof(kExampleRSAKeyDER));
  ASSERT_TRUE(rsa);
  EXPECT_EQ(PrintToString(rsa.get(), /*indent=*/2, &EVP_PKEY_print_params),
            "  Parameters algorithm unsupported\n");
  EXPECT_EQ(PrintToString(rsa.get(), /*indent=*/2, &EVP_PKEY_print_public),
            R"(  Public-Key: (1024 bit)
  Modulus:
      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:
      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:
      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:
      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:
      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:
      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:
      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:
      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:
      a7:2c:2b:b5:af:64:4b:61:07
  Exponent: 65537 (0x10001)
)");
  EXPECT_EQ(PrintToString(rsa.get(), /*indent=*/2, &EVP_PKEY_print_private),
            R"(  Private-Key: (1024 bit)
  modulus:
      00:f8:b8:6c:83:b4:bc:d9:a8:57:c0:a5:b4:59:76:
      8c:54:1d:79:eb:22:52:04:7e:d3:37:eb:41:fd:83:
      f9:f0:a6:85:15:34:75:71:5a:84:a8:3c:d2:ef:5a:
      4e:d3:de:97:8a:dd:ff:bb:cf:0a:aa:86:92:be:b8:
      50:e4:cd:6f:80:33:30:76:13:8f:ca:7b:dc:ec:5a:
      ca:63:c7:03:25:ef:a8:8a:83:58:76:20:fa:16:77:
      d7:79:92:63:01:48:1a:d8:7b:67:f1:52:55:49:4e:
      d6:6e:4a:5c:d7:7a:37:36:0c:de:dd:8f:44:e8:c2:
      a7:2c:2b:b5:af:64:4b:61:07
  publicExponent: 65537 (0x10001)
  privateExponent:
      74:88:64:3f:69:45:3a:6d:c7:7f:b9:a3:c0:6e:ec:
      dc:d4:5a:b5:32:85:5f:19:d4:f8:d4:3f:3c:fa:c2:
      f6:5f:ee:e6:ba:87:74:2e:c7:0c:d4:42:b8:66:85:
      9c:7b:24:61:aa:16:11:f6:b5:b6:a4:0a:c9:55:2e:
      81:a5:47:61:cb:25:8f:c2:15:7b:0e:7c:36:9f:3a:
      da:58:86:1c:5b:83:79:e6:2b:cc:e6:fa:2c:61:f2:
      78:80:1b:e2:f3:9d:39:2b:65:57:91:3d:71:99:73:
      a5:c2:79:20:8c:07:4f:e5:b4:60:1f:99:a2:b1:4f:
      0c:ef:bc:59:53:00:7d:b1
  prime1:
      00:fc:7e:23:65:70:f8:ce:d3:40:41:80:6a:1d:01:
      d6:01:ff:b6:1b:3d:3d:59:09:33:79:c0:4f:de:96:
      27:4b:18:c6:d9:78:f1:f4:35:46:e9:7c:42:7a:5d:
      9f:ef:54:b8:f7:9f:c4:33:6c:f3:8c:32:46:87:67:
      30:7b:a7:ac:e3
  prime2:
      00:fc:2c:df:0c:0d:88:f5:b1:92:a8:93:47:63:55:
      f5:ca:58:43:ba:1c:e5:9e:b6:95:05:cd:b5:82:df:
      eb:04:53:9d:bd:c2:38:16:b3:62:dd:a1:46:db:6d:
      97:93:9f:8a:c3:9b:64:7e:42:e3:32:57:19:1b:d5:
      6e:85:fa:b8:8d
  exponent1:
      00:bc:3d:de:6d:d6:97:e8:ba:9e:81:37:17:e5:a0:
      64:c9:00:b7:e7:fe:f4:29:d9:2e:43:6b:19:20:bd:
      99:75:e7:76:f8:d3:ae:af:7e:b8:eb:81:f4:9d:fe:
      07:2b:0b:63:0b:5a:55:90:71:7d:f1:db:d9:b1:41:
      41:68:2f:4e:39
  exponent2:
      5a:34:66:d8:f5:e2:7f:18:b5:00:6e:26:84:27:14:
      93:fb:fc:c6:0f:5e:27:e6:e1:e9:c0:8a:e4:34:da:
      e9:a2:4b:73:bc:8c:b9:ba:13:6c:7a:2b:51:84:a3:
      4a:e0:30:10:06:7e:ed:17:5a:14:00:c9:ef:85:ea:
      52:2c:bc:65
  coefficient:
      51:e3:f2:83:19:9b:c4:1e:2f:50:3d:df:5a:a2:18:
      ca:5f:2e:49:af:6f:cc:fa:65:77:94:b5:a1:0a:a9:
      d1:8a:39:37:f4:0b:a0:d7:82:27:5e:ae:17:17:a1:
      1e:54:34:bf:6e:c4:8e:99:5d:08:f1:2d:86:9d:a5:
      20:1b:e5:df
)");

  bssl::UniquePtr<EVP_PKEY> dsa = ParsePrivateKey(
      EVP_PKEY_DSA, kExampleDSAKeyDER, sizeof(kExampleDSAKeyDER));
  ASSERT_TRUE(dsa);
  EXPECT_EQ(PrintToString(dsa.get(), /*indent=*/2, &EVP_PKEY_print_params),
            R"(  DSA-Parameters: (2048 bit)
  P:
      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:
      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:
      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:
      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:
      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:
      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:
      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:
      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:
      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:
      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:
      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:
      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:
      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:
      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:
      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:
      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:
      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:
      3d:2b
  Q:
      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:
      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:
      b5:4f:c3
  G:
      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:
      f4:a4:93:59:12:20:22:36:69:cf:41:93:ed:ab:42:
      3a:d0:8d:fb:55:2e:30:8a:6a:57:a5:ff:bc:7c:d0:
      fb:20:87:f8:1f:8d:f0:cb:08:ab:21:33:28:7d:2b:
      69:68:71:4a:94:f6:33:c9:40:84:5a:48:a3:e1:67:
      08:dd:e7:61:cc:6a:8e:ab:2d:84:db:21:b6:ea:5b:
      07:68:14:93:cc:9c:31:fb:c3:68:b2:43:f6:dd:f8:
      c9:32:a8:b4:03:8f:44:e7:b1:5c:a8:76:34:4a:14:
      78:59:f2:b4:3b:39:45:86:68:ad:5e:0a:1a:9a:66:
      95:46:dd:28:12:e3:b3:61:7a:0a:ef:99:d5:8e:3b:
      b4:cc:87:fd:94:22:5e:01:d2:dc:c4:69:a7:72:68:
      14:6c:51:91:8f:18:e8:b4:d7:0a:a1:f0:c7:62:3b:
      cc:52:cf:37:31:d3:86:41:b2:d2:83:0b:7e:ec:b2:
      f0:95:52:ff:13:7d:04:6e:49:4e:7f:33:c3:59:00:
      02:b1:6d:1b:97:d9:36:fd:a2:8f:90:c3:ed:3c:a3:
      53:38:16:8a:c1:6f:77:c3:c5:7a:dc:2e:8f:7c:6c:
      22:56:e4:1a:5f:65:45:05:90:db:b5:bc:f0:6d:66:
      61
)");
  EXPECT_EQ(PrintToString(dsa.get(), /*indent=*/2, &EVP_PKEY_print_public),
            R"(  Public-Key: (2048 bit)
  pub:
      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:
      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:
      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:
      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:
      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:
      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:
      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:
      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:
      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:
      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:
      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:
      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:
      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:
      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:
      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:
      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:
      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:
      cc
  P:
      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:
      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:
      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:
      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:
      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:
      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:
      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:
      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:
      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:
      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:
      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:
      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:
      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:
      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:
      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:
      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:
      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:
      3d:2b
  Q:
      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:
      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:
      b5:4f:c3
  G:
      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:
      f4:a4:93:59:12:20:22:36:69:cf:41:93:ed:ab:42:
      3a:d0:8d:fb:55:2e:30:8a:6a:57:a5:ff:bc:7c:d0:
      fb:20:87:f8:1f:8d:f0:cb:08:ab:21:33:28:7d:2b:
      69:68:71:4a:94:f6:33:c9:40:84:5a:48:a3:e1:67:
      08:dd:e7:61:cc:6a:8e:ab:2d:84:db:21:b6:ea:5b:
      07:68:14:93:cc:9c:31:fb:c3:68:b2:43:f6:dd:f8:
      c9:32:a8:b4:03:8f:44:e7:b1:5c:a8:76:34:4a:14:
      78:59:f2:b4:3b:39:45:86:68:ad:5e:0a:1a:9a:66:
      95:46:dd:28:12:e3:b3:61:7a:0a:ef:99:d5:8e:3b:
      b4:cc:87:fd:94:22:5e:01:d2:dc:c4:69:a7:72:68:
      14:6c:51:91:8f:18:e8:b4:d7:0a:a1:f0:c7:62:3b:
      cc:52:cf:37:31:d3:86:41:b2:d2:83:0b:7e:ec:b2:
      f0:95:52:ff:13:7d:04:6e:49:4e:7f:33:c3:59:00:
      02:b1:6d:1b:97:d9:36:fd:a2:8f:90:c3:ed:3c:a3:
      53:38:16:8a:c1:6f:77:c3:c5:7a:dc:2e:8f:7c:6c:
      22:56:e4:1a:5f:65:45:05:90:db:b5:bc:f0:6d:66:
      61
)");
  EXPECT_EQ(PrintToString(dsa.get(), /*indent=*/2, &EVP_PKEY_print_private),
            R"(  Private-Key: (2048 bit)
  priv:
      00:b0:c7:68:70:27:43:bc:51:24:29:93:a9:71:a5:
      28:89:79:54:44:f7:c6:45:22:03:d0:ce:84:fe:61:
      17:d4:6e
  pub:
      31:97:31:a1:4e:38:56:88:db:94:1d:bf:65:5c:da:
      4b:c2:10:de:74:20:03:ce:13:60:f2:25:1d:55:7c:
      5d:94:82:54:08:53:db:85:95:bf:dd:5e:50:d5:96:
      e0:79:51:1b:bf:4d:4e:b9:3a:c5:ee:c4:5e:98:75:
      7b:be:ff:30:e6:d0:7b:a6:f1:bc:29:ea:df:ec:f3:
      8b:fa:83:11:9f:3f:f0:5d:06:51:32:aa:21:fc:26:
      17:e7:50:c2:16:ba:fa:54:b7:7e:1d:2c:a6:a3:41:
      66:33:94:83:b9:bf:a0:4f:bd:a6:fd:2c:81:58:35:
      33:39:c0:6d:33:40:56:64:12:5a:cd:35:53:21:78:
      8f:27:24:37:66:8a:df:5e:5f:63:fc:8b:2d:ef:57:
      db:40:25:d5:17:53:0b:e4:a5:ae:54:bf:46:4f:a6:
      79:c3:74:fa:1f:85:34:64:6d:c5:03:eb:72:98:80:
      7b:c0:8f:35:11:a7:09:eb:51:e0:b0:ac:92:14:f2:
      ad:37:95:5a:ba:8c:c4:db:ed:c4:4e:8b:8f:84:33:
      64:f8:57:12:d7:08:7e:90:66:df:91:50:23:f2:73:
      c0:6b:b1:15:dd:64:d7:c9:75:17:73:72:da:33:c4:
      6f:a5:47:a1:cc:d1:c6:62:e5:ca:ab:5f:2a:8f:6b:
      cc
  P:
      00:9e:12:fa:b3:de:12:21:35:01:dd:82:aa:10:ca:
      2d:10:1d:2d:4e:bf:ef:4d:2a:3f:8d:aa:0f:e0:ce:
      da:d8:d6:af:85:61:6a:a2:f3:25:2c:0a:2b:5a:6d:
      b0:9e:6f:14:90:0e:0d:db:83:11:87:6d:d8:f9:66:
      95:25:f9:9e:d6:59:49:e1:84:d5:06:47:93:27:11:
      69:a2:28:68:0b:95:ec:12:f5:9a:8e:20:b2:1f:2b:
      58:eb:2a:20:12:d3:5b:de:2e:e3:51:82:2f:e8:f3:
      2d:0a:33:05:65:dc:ce:5c:67:2b:72:59:c1:4b:24:
      33:d0:b5:b2:ca:2b:2d:b0:ab:62:6e:8f:13:f4:7f:
      e0:34:5d:90:4e:72:94:bb:03:8e:9c:e2:1a:9e:58:
      0b:83:35:62:78:70:6c:fe:76:84:36:c6:9d:e1:49:
      cc:ff:98:b4:aa:b8:cb:4f:63:85:c9:f1:02:ce:59:
      34:6e:ae:ef:27:e0:ad:22:2d:53:d6:e8:9c:c8:cd:
      e5:77:6d:d0:00:57:b0:3f:2d:88:ab:3c:ed:ba:fd:
      7b:58:5f:0b:7f:78:35:e1:7a:37:28:bb:f2:5e:a6:
      25:72:f2:45:dc:11:1f:3c:e3:9c:b6:ff:ac:c3:1b:
      0a:27:90:e7:bd:e9:02:24:ea:9b:09:31:53:62:af:
      3d:2b
  Q:
      00:f3:81:dc:f5:3e:bf:72:4f:8b:2e:5c:a8:2c:01:
      0f:b4:b5:ed:a9:35:8d:0f:d8:8e:d2:78:58:94:88:
      b5:4f:c3
  G:
      0c:40:2a:72:5d:cc:3a:62:e0:2b:f4:cf:43:cd:17:
      f4:a4:93:59:12:20:22:36:69:cf:41:93:ed:ab:42:
      3a:d0:8d:fb:55:2e:30:8a:6a:57:a5:ff:bc:7c:d0:
      fb:20:87:f8:1f:8d:f0:cb:08:ab:21:33:28:7d:2b:
      69:68:71:4a:94:f6:33:c9:40:84:5a:48:a3:e1:67:
      08:dd:e7:61:cc:6a:8e:ab:2d:84:db:21:b6:ea:5b:
      07:68:14:93:cc:9c:31:fb:c3:68:b2:43:f6:dd:f8:
      c9:32:a8:b4:03:8f:44:e7:b1:5c:a8:76:34:4a:14:
      78:59:f2:b4:3b:39:45:86:68:ad:5e:0a:1a:9a:66:
      95:46:dd:28:12:e3:b3:61:7a:0a:ef:99:d5:8e:3b:
      b4:cc:87:fd:94:22:5e:01:d2:dc:c4:69:a7:72:68:
      14:6c:51:91:8f:18:e8:b4:d7:0a:a1:f0:c7:62:3b:
      cc:52:cf:37:31:d3:86:41:b2:d2:83:0b:7e:ec:b2:
      f0:95:52:ff:13:7d:04:6e:49:4e:7f:33:c3:59:00:
      02:b1:6d:1b:97:d9:36:fd:a2:8f:90:c3:ed:3c:a3:
      53:38:16:8a:c1:6f:77:c3:c5:7a:dc:2e:8f:7c:6c:
      22:56:e4:1a:5f:65:45:05:90:db:b5:bc:f0:6d:66:
      61
)");

  bssl::UniquePtr<EVP_PKEY> ec =
      ParsePrivateKey(EVP_PKEY_EC, kExampleECKeyDER, sizeof(kExampleECKeyDER));
  ASSERT_TRUE(ec);
  EXPECT_EQ(PrintToString(ec.get(), /*indent=*/2, &EVP_PKEY_print_params),
            "  ECDSA-Parameters: (P-256)\n");
  EXPECT_EQ(PrintToString(ec.get(), /*indent=*/2, &EVP_PKEY_print_public),
            R"(  Public-Key: (P-256)
  pub:
      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:
      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:
      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:
      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:
      4b:cf:72:22:c1
)");
  EXPECT_EQ(PrintToString(ec.get(), /*indent=*/2, &EVP_PKEY_print_private),
            R"(  Private-Key: (P-256)
  priv:
      07:0f:08:72:7a:d4:a0:4a:9c:dd:59:c9:4d:89:68:
      77:08:b5:6f:c9:5d:30:77:0e:e8:d1:c9:ce:0a:8b:
      b4:6a
  pub:
      04:e6:2b:69:e2:bf:65:9f:97:be:2f:1e:0d:94:8a:
      4c:d5:97:6b:b7:a9:1e:0d:46:fb:dd:a9:a9:1e:9d:
      dc:ba:5a:01:e7:d6:97:a8:0a:18:f9:c3:c4:a3:1e:
      56:e2:7c:83:48:db:16:1a:1c:f5:1d:7e:f1:94:2d:
      4b:cf:72:22:c1
)");
}